

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O1

bool __thiscall
tcu::TestSessionExecutor::enterTestCase
          (TestSessionExecutor *this,TestCase *testCase,string *casePath)

{
  TestLog *this_00;
  TestCaseExecutor *pTVar1;
  qpTestCaseType qVar2;
  deUint64 dVar3;
  qpTestCaseType testCaseType;
  
  this_00 = this->m_testCtx->m_log;
  qVar2 = (testCase->super_TestNode).m_nodeType - QP_TEST_CASE_TYPE_ACCURACY;
  testCaseType = QP_TEST_CASE_TYPE_LAST;
  if (qVar2 < QP_TEST_CASE_TYPE_LAST) {
    testCaseType = qVar2;
  }
  tcu::print("\nTest case \'%s\'..\n",(casePath->_M_dataplus)._M_p);
  TestContext::setTestResult
            (this->m_testCtx,QP_TEST_RESULT_LAST,glcts::fixed_sample_locations_values + 1);
  this->m_testCtx->m_terminateAfter = false;
  TestLog::startCase(this_00,(casePath->_M_dataplus)._M_p,testCaseType);
  this->m_isInTestCase = true;
  dVar3 = deGetMicroseconds();
  this->m_testStartTime = dVar3;
  pTVar1 = (this->m_caseExecutor).
           super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>.
           m_data.ptr;
  (*pTVar1->_vptr_TestCaseExecutor[2])(pTVar1,testCase,casePath);
  return true;
}

Assistant:

bool TestSessionExecutor::enterTestCase (TestCase* testCase, const std::string& casePath)
{
	TestLog&				log			= m_testCtx.getLog();
	const qpTestCaseType	caseType	= nodeTypeToTestCaseType(testCase->getNodeType());
	bool					initOk		= false;

	print("\nTest case '%s'..\n", casePath.c_str());

	m_testCtx.setTestResult(QP_TEST_RESULT_LAST, "");
	m_testCtx.setTerminateAfter(false);
	log.startCase(casePath.c_str(), caseType);

	m_isInTestCase	= true;
	m_testStartTime	= deGetMicroseconds();

	try
	{
		m_caseExecutor->init(testCase, casePath);
		initOk = true;
	}
	catch (const std::bad_alloc&)
	{
		DE_ASSERT(!initOk);
		m_testCtx.setTestResult(QP_TEST_RESULT_RESOURCE_ERROR, "Failed to allocate memory in test case init");
		m_testCtx.setTerminateAfter(true);
	}
	catch (const tcu::TestException& e)
	{
		DE_ASSERT(!initOk);
		DE_ASSERT(e.getTestResult() != QP_TEST_RESULT_LAST);
		m_testCtx.setTestResult(e.getTestResult(), e.getMessage());
		m_testCtx.setTerminateAfter(e.isFatal());
		log << e;
	}
	catch (const tcu::Exception& e)
	{
		DE_ASSERT(!initOk);
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, e.getMessage());
		log << e;
	}

	DE_ASSERT(initOk || m_testCtx.getTestResult() != QP_TEST_RESULT_LAST);

	return initOk;
}